

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O0

void GD::sync_weights(vw *all)

{
  bool bVar1;
  float *pfVar2;
  long *in_RDI;
  float fVar3;
  iterator iVar4;
  weight *w_1;
  iterator __end2_1;
  iterator __begin2_1;
  dense_parameters *__range2_1;
  weight *w;
  iterator __end2;
  iterator __begin2;
  sparse_parameters *__range2;
  sparse_iterator<float> *in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  dense_parameters *in_stack_ffffffffffffff80;
  dense_iterator<float> local_78;
  long *local_60;
  float *local_58;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_50;
  uint32_t local_48;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_40;
  uint32_t local_38;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_30;
  uint32_t local_28;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_20;
  uint32_t local_18;
  long *local_10;
  long *local_8;
  
  if ((((*(double *)(*in_RDI + 0x58) != 0.0) || (NAN(*(double *)(*in_RDI + 0x58)))) ||
      (*(double *)(*in_RDI + 0x60) != 1.0)) || (NAN(*(double *)(*in_RDI + 0x60)))) {
    local_8 = in_RDI;
    if ((*(byte *)(in_RDI + 0x6b2) & 1) == 0) {
      local_60 = in_RDI + 0x6b3;
      dense_parameters::begin(in_stack_ffffffffffffff80);
      dense_parameters::end(in_stack_ffffffffffffff80);
      while (bVar1 = dense_iterator<float>::operator!=
                               (&local_78,(dense_iterator<float> *)&stack0xffffffffffffff70), bVar1)
      {
        pfVar2 = dense_iterator<float>::operator*(&local_78);
        fVar3 = trunc_weight(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70);
        *pfVar2 = fVar3 * (float)*(double *)(*local_8 + 0x60);
        dense_iterator<float>::operator++(&local_78);
      }
    }
    else {
      local_10 = in_RDI + 0x6b6;
      iVar4 = sparse_parameters::begin
                        ((sparse_parameters *)
                         CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      local_30._M_cur =
           (__node_type *)
           iVar4._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
           _M_cur;
      local_28 = iVar4._stride;
      local_20._M_cur = local_30._M_cur;
      local_18 = local_28;
      iVar4 = sparse_parameters::end
                        ((sparse_parameters *)
                         CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      local_50._M_cur =
           (__node_type *)
           iVar4._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
           _M_cur;
      local_48 = iVar4._stride;
      local_40._M_cur = local_50._M_cur;
      local_38 = local_48;
      while (bVar1 = sparse_iterator<float>::operator!=
                               ((sparse_iterator<float> *)
                                CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                in_stack_ffffffffffffff68), bVar1) {
        local_58 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x1cf22c);
        fVar3 = trunc_weight(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70);
        *local_58 = fVar3 * (float)*(double *)(*local_8 + 0x60);
        sparse_iterator<float>::operator++
                  ((sparse_iterator<float> *)
                   CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      }
    }
    *(undefined8 *)(*local_8 + 0x58) = 0;
    *(undefined8 *)(*local_8 + 0x60) = 0x3ff0000000000000;
  }
  return;
}

Assistant:

void sync_weights(vw& all)
{
  // todo, fix length dependence
  if (all.sd->gravity == 0. && all.sd->contraction == 1.)  // to avoid unnecessary weight synchronization
    return;

  if (all.weights.sparse)
    for (weight& w : all.weights.sparse_weights)
      w = trunc_weight(w, (float)all.sd->gravity) * (float)all.sd->contraction;
  else
    for (weight& w : all.weights.dense_weights)
      w = trunc_weight(w, (float)all.sd->gravity) * (float)all.sd->contraction;

  all.sd->gravity = 0.;
  all.sd->contraction = 1.;
}